

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O0

void TTD::NSTokens::CleanupKeyNamesArray(char16 ***names,size_t **lengths)

{
  size_t **lengths_local;
  char16 ***names_local;
  
  if (*names != (char16 **)0x0) {
    Memory::DeleteArray<Memory::HeapAllocator,char16_t_const*>
              (&Memory::HeapAllocator::Instance,0x78,*names);
    *names = (char16 **)0x0;
  }
  if (*lengths != (size_t *)0x0) {
    Memory::DeleteArray<Memory::HeapAllocator,unsigned_long>
              (&Memory::HeapAllocator::Instance,0x78,*lengths);
    *lengths = (size_t *)0x0;
  }
  return;
}

Assistant:

void CleanupKeyNamesArray(const char16*** names, size_t** lengths)
        {
            if(*names != nullptr)
            {
                TT_HEAP_FREE_ARRAY(char16*, *names, (uint32)NSTokens::Key::Count);
                *names = nullptr;
            }

            if(*lengths != nullptr)
            {
                TT_HEAP_FREE_ARRAY(size_t, *lengths, (uint32)NSTokens::Key::Count);
                *lengths = nullptr;
            }
        }